

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pragma_database_size.cpp
# Opt level: O1

unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
 duckdb::PragmaDatabaseSizeInit(ClientContext *context,TableFunctionInitInput *input)

{
  pointer prVar1;
  int iVar2;
  element_type *this;
  DatabaseManager *this_00;
  pointer pPVar3;
  BufferManager *pBVar4;
  undefined4 extraout_var;
  StringUtil *this_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> multiplier;
  templated_unique_single_t result;
  _Head_base<0UL,_duckdb::PragmaDatabaseSizeData_*,_false> local_b0;
  pointer local_a8;
  element_type *peStack_a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_98;
  string local_60;
  string local_40;
  undefined4 extraout_var_00;
  
  this = (element_type *)operator_new(0xa8);
  PragmaDatabaseSizeData::PragmaDatabaseSizeData((PragmaDatabaseSizeData *)this);
  local_b0._M_head_impl = (PragmaDatabaseSizeData *)this;
  this_00 = DatabaseManager::Get((ClientContext *)input);
  DatabaseManager::GetDatabases
            ((vector<std::reference_wrapper<duckdb::AttachedDatabase>,_true> *)&local_a8,this_00,
             (ClientContext *)input);
  pPVar3 = unique_ptr<duckdb::PragmaDatabaseSizeData,_std::default_delete<duckdb::PragmaDatabaseSizeData>,_true>
           ::operator->((unique_ptr<duckdb::PragmaDatabaseSizeData,_std::default_delete<duckdb::PragmaDatabaseSizeData>,_true>
                         *)&local_b0);
  multiplier._M_pi = local_98._M_pi;
  prVar1 = (pPVar3->databases).
           super_vector<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
           .
           super__Vector_base<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  (pPVar3->databases).
  super_vector<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
  ._M_impl.super__Vector_impl_data._M_start = local_a8;
  (pPVar3->databases).
  super_vector<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)peStack_a0;
  (pPVar3->databases).
  super_vector<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::AttachedDatabase>,_std::allocator<std::reference_wrapper<duckdb::AttachedDatabase>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_98._M_pi;
  local_a8 = (pointer)0x0;
  peStack_a0 = (element_type *)0x0;
  local_98._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (prVar1 != (pointer)0x0) {
    operator_delete(prVar1);
  }
  if (local_a8 != (pointer)0x0) {
    operator_delete(local_a8);
  }
  pBVar4 = BufferManager::GetBufferManager((ClientContext *)input);
  iVar2 = (*pBVar4->_vptr_BufferManager[10])(pBVar4);
  StringUtil::BytesToHumanReadableString_abi_cxx11_
            (&local_40,(StringUtil *)CONCAT44(extraout_var,iVar2),0x400,(idx_t)multiplier._M_pi);
  Value::Value((Value *)&local_a8,&local_40);
  pPVar3 = unique_ptr<duckdb::PragmaDatabaseSizeData,_std::default_delete<duckdb::PragmaDatabaseSizeData>,_true>
           ::operator->((unique_ptr<duckdb::PragmaDatabaseSizeData,_std::default_delete<duckdb::PragmaDatabaseSizeData>,_true>
                         *)&local_b0);
  Value::operator=(&pPVar3->memory_usage,(Value *)&local_a8);
  Value::~Value((Value *)&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  iVar2 = (*pBVar4->_vptr_BufferManager[0xb])(pBVar4);
  this_01 = (StringUtil *)CONCAT44(extraout_var_00,iVar2);
  if (this_01 == (StringUtil *)0xffffffffffffffff) {
    Value::Value((Value *)&local_a8,"Unlimited");
  }
  else {
    StringUtil::BytesToHumanReadableString_abi_cxx11_
              (&local_60,this_01,0x400,(idx_t)multiplier._M_pi);
    Value::Value((Value *)&local_a8,&local_60);
  }
  pPVar3 = unique_ptr<duckdb::PragmaDatabaseSizeData,_std::default_delete<duckdb::PragmaDatabaseSizeData>,_true>
           ::operator->((unique_ptr<duckdb::PragmaDatabaseSizeData,_std::default_delete<duckdb::PragmaDatabaseSizeData>,_true>
                         *)&local_b0);
  Value::operator=(&pPVar3->memory_limit,(Value *)&local_a8);
  Value::~Value((Value *)&local_a8);
  if ((this_01 != (StringUtil *)0xffffffffffffffff) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2)) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  (context->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
  super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_b0._M_head_impl;
  return (unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
          )(unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
            )context;
}

Assistant:

unique_ptr<GlobalTableFunctionState> PragmaDatabaseSizeInit(ClientContext &context, TableFunctionInitInput &input) {
	auto result = make_uniq<PragmaDatabaseSizeData>();
	result->databases = DatabaseManager::Get(context).GetDatabases(context);
	auto &buffer_manager = BufferManager::GetBufferManager(context);
	result->memory_usage = Value(StringUtil::BytesToHumanReadableString(buffer_manager.GetUsedMemory()));
	auto max_memory = buffer_manager.GetMaxMemory();
	result->memory_limit =
	    max_memory == (idx_t)-1 ? Value("Unlimited") : Value(StringUtil::BytesToHumanReadableString(max_memory));

	return std::move(result);
}